

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

void Abc_NodeFromMapCutPhase(Abc_Ntk_t *pNtkNew,Map_Cut_t *pCut,int fPhase)

{
  uint uVar1;
  int nNodePis;
  Map_Super_t *pSuper;
  Map_Node_t **ppMVar2;
  Abc_Obj_t *pAVar3;
  int nLeaves;
  int fInvPin;
  int i;
  uint uPhaseBest;
  Map_Super_t *pSuperBest;
  Map_Node_t **ppLeaves;
  Abc_Obj_t *pNodePIs [10];
  int fPhase_local;
  Map_Cut_t *pCut_local;
  Abc_Ntk_t *pNtkNew_local;
  
  pSuper = Map_CutReadSuperBest(pCut,fPhase);
  if (pSuper != (Map_Super_t *)0x0) {
    uVar1 = Map_CutReadPhaseBest(pCut,fPhase);
    nNodePis = Map_CutReadLeavesNum(pCut);
    ppMVar2 = Map_CutReadLeaves(pCut);
    for (nLeaves = 0; nLeaves < nNodePis; nLeaves = nLeaves + 1) {
      pAVar3 = (Abc_Obj_t *)
               Map_NodeReadData(ppMVar2[nLeaves],
                                (uint)(((uVar1 & 1 << ((byte)nLeaves & 0x1f)) != 0 ^ 0xffU) & 1));
      pNodePIs[(long)nLeaves + -1] = pAVar3;
      if (pNodePIs[(long)nLeaves + -1] == (Abc_Obj_t *)0x0) {
        __assert_fail("pNodePIs[i] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                      ,0x29a,"void Abc_NodeFromMapCutPhase(Abc_Ntk_t *, Map_Cut_t *, int)");
      }
    }
    Abc_NodeFromMapSuperChoice_rec(pNtkNew,pSuper,(Abc_Obj_t **)&ppLeaves,nNodePis);
  }
  return;
}

Assistant:

void Abc_NodeFromMapCutPhase( Abc_Ntk_t * pNtkNew, Map_Cut_t * pCut, int fPhase )
{
    Abc_Obj_t * pNodePIs[10];
    Map_Node_t ** ppLeaves;
    Map_Super_t * pSuperBest;
    unsigned uPhaseBest;
    int i, fInvPin, nLeaves;

    pSuperBest = Map_CutReadSuperBest( pCut, fPhase );
    if ( pSuperBest == NULL )
        return;

    // get the information about the best cut 
    uPhaseBest = Map_CutReadPhaseBest( pCut, fPhase );
    nLeaves    = Map_CutReadLeavesNum( pCut );
    ppLeaves   = Map_CutReadLeaves( pCut );

    // collect the PI nodes
    for ( i = 0; i < nLeaves; i++ )
    {
        fInvPin = ((uPhaseBest & (1 << i)) > 0);
        pNodePIs[i] = (Abc_Obj_t *)Map_NodeReadData( ppLeaves[i], !fInvPin );
        assert( pNodePIs[i] != NULL );
    }

    // implement the supergate
    Abc_NodeFromMapSuperChoice_rec( pNtkNew, pSuperBest, pNodePIs, nLeaves );
}